

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O3

void duckdb_je_emap_deregister_boundary(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  rtree_ctx_t *ctx;
  rtree_leaf_elm_t *elm_b;
  rtree_leaf_elm_t *elm_a;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  emap_rtree_leaf_elms_lookup(tsdn,emap,ctx,edata,true,false,&elm_a,&elm_b);
  (elm_a->le_bits).repr = (void *)0xe8000000000000;
  if (elm_b != (rtree_leaf_elm_t *)0x0) {
    (elm_b->le_bits).repr = (void *)0xe8000000000000;
  }
  return;
}

Assistant:

void
emap_deregister_boundary(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	/*
	 * The edata must be either in an acquired state, or protected by state
	 * based locks.
	 */
	if (!emap_edata_is_acquired(tsdn, emap, edata)) {
		witness_assert_positive_depth_to_rank(
		    tsdn_witness_tsdp_get(tsdn), WITNESS_RANK_CORE);
	}

	EMAP_DECLARE_RTREE_CTX;
	rtree_leaf_elm_t *elm_a, *elm_b;

	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, edata,
	    true, false, &elm_a, &elm_b);
	emap_rtree_write_acquired(tsdn, emap, elm_a, elm_b, NULL, SC_NSIZES,
	    false);
}